

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

void xmlSetListDoc(xmlNodePtr list,xmlDocPtr doc)

{
  if ((list != (xmlNodePtr)0x0) && (list->type != XML_NAMESPACE_DECL)) {
    for (; list != (xmlNodePtr)0x0; list = list->next) {
      if (list->doc != doc) {
        xmlSetTreeDoc(list,doc);
      }
    }
  }
  return;
}

Assistant:

void
xmlSetListDoc(xmlNodePtr list, xmlDocPtr doc) {
    xmlNodePtr cur;

    if ((list == NULL) || (list->type == XML_NAMESPACE_DECL))
	return;
    cur = list;
    while (cur != NULL) {
	if (cur->doc != doc)
	    xmlSetTreeDoc(cur, doc);
	cur = cur->next;
    }
}